

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O3

AccelStructWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateAccelStruct
          (AccelStructWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkAccelerationStructureCreateInfoKHR *CI,char *DebugName)

{
  string msg;
  string local_48;
  
  if (CI->sType != VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_CREATE_INFO_KHR) {
    Diligent::FormatString<char[26],char[69]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CI.sType == VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_CREATE_INFO_KHR"
               ,(char (*) [69])DebugName);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CreateAccelStruct",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x185);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  CreateVulkanObject<VkAccelerationStructureKHR_T*,(VulkanUtilities::VulkanHandleTypeId)21,VkResult(*)(VkDevice_T*,VkAccelerationStructureCreateInfoKHR_const*,VkAllocationCallbacks_const*,VkAccelerationStructureKHR_T**),VkAccelerationStructureCreateInfoKHR>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkAccelerationStructureCreateInfoKHR_ptr_VkAllocationCallbacks_ptr_VkAccelerationStructureKHR_T_ptr_ptr
              *)vkCreateAccelerationStructureKHR,CI,DebugName,"acceleration structure");
  return __return_storage_ptr__;
}

Assistant:

AccelStructWrapper VulkanLogicalDevice::CreateAccelStruct(const VkAccelerationStructureCreateInfoKHR& CI, const char* DebugName) const
{
#if DILIGENT_USE_VOLK
    VERIFY_EXPR(CI.sType == VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_CREATE_INFO_KHR);
    return CreateVulkanObject<VkAccelerationStructureKHR, VulkanHandleTypeId::AccelerationStructureKHR>(vkCreateAccelerationStructureKHR, CI, DebugName, "acceleration structure");
#else
    UNSUPPORTED("vkCreateAccelerationStructureKHR is only available through Volk");
    return AccelStructWrapper{};
#endif
}